

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O3

int64_t __thiscall
duckdb::CastFunctionSet::ImplicitCastCost
          (CastFunctionSet *this,LogicalType *source,LogicalType *target)

{
  MapCastNode *in_RAX;
  int64_t iVar1;
  optional_ptr<duckdb::MapCastNode,_true> entry;
  optional_ptr<duckdb::MapCastNode,_true> local_28;
  
  local_28.ptr = in_RAX;
  if ((this->map_info).ptr != (MapCastInfo *)0x0) {
    optional_ptr<duckdb::MapCastInfo,_true>::CheckValid(&this->map_info);
    local_28 = MapCastInfo::GetEntry((this->map_info).ptr,source,target);
    if (local_28.ptr != (MapCastNode *)0x0) {
      optional_ptr<duckdb::MapCastNode,_true>::CheckValid(&local_28);
      return (local_28.ptr)->implicit_cast_cost;
    }
  }
  iVar1 = CastRules::ImplicitCast(source,target);
  if ((((iVar1 < 0) && ((this->config).ptr != (DBConfig *)0x0)) &&
      (optional_ptr<duckdb::DBConfig,_true>::CheckValid(&this->config),
      (((this->config).ptr)->options).old_implicit_casting == true)) &&
     ((source->id_ != BLOB && (target->id_ == VARCHAR)))) {
    iVar1 = 0x95;
  }
  return iVar1;
}

Assistant:

int64_t CastFunctionSet::ImplicitCastCost(const LogicalType &source, const LogicalType &target) {
	// check if a cast has been registered
	if (map_info) {
		auto entry = map_info->GetEntry(source, target);
		if (entry) {
			return entry->implicit_cast_cost;
		}
	}
	// if not, fallback to the default implicit cast rules
	auto score = CastRules::ImplicitCast(source, target);
	if (score < 0 && config && config->options.old_implicit_casting) {
		if (source.id() != LogicalTypeId::BLOB && target.id() == LogicalTypeId::VARCHAR) {
			score = 149;
		}
	}
	return score;
}